

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
          (Environment *this,Variable<deqp::gls::BuiltinPrecisionTests::Void> *variable,IVal *value)

{
  void *pvVar1;
  ArrayDeleter<unsigned_char> local_59;
  SharedPtr<unsigned_char> local_58;
  string local_48;
  void *local_28;
  deUint8 *data;
  IVal *value_local;
  Variable<deqp::gls::BuiltinPrecisionTests::Void> *variable_local;
  Environment *this_local;
  
  data = (deUint8 *)value;
  value_local = (IVal *)variable;
  variable_local = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)this;
  local_28 = operator_new__(1);
  ::deMemcpy(local_28,data,1);
  Variable<deqp::gls::BuiltinPrecisionTests::Void>::getName_abi_cxx11_
            (&local_48,(Variable<deqp::gls::BuiltinPrecisionTests::Void> *)value_local);
  pvVar1 = local_28;
  de::ArrayDeleter<unsigned_char>::ArrayDeleter(&local_59);
  de::SharedPtr<unsigned_char>::SharedPtr<de::ArrayDeleter<unsigned_char>>(&local_58,pvVar1);
  de::
  insert<std::map<std::__cxx11::string,de::SharedPtr<unsigned_char>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,de::SharedPtr<unsigned_char>>>>>
            (&this->m_map,&local_48,&local_58);
  de::SharedPtr<unsigned_char>::~SharedPtr(&local_58);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void						bind	(const Variable<T>&					variable,
										 const typename Traits<T>::IVal&	value)
	{
		deUint8* const data = new deUint8[sizeof(value)];

		deMemcpy(data, &value, sizeof(value));
		de::insert(m_map, variable.getName(), SharedPtr<deUint8>(data, de::ArrayDeleter<deUint8>()));
	}